

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkFromAigPhase(Aig_Man_t *pMan)

{
  void *pvVar1;
  void *pvVar2;
  Abc_Ntk_t *pNtk;
  Abc_Obj_t *pAVar3;
  ulong uVar4;
  Abc_Obj_t *pAVar5;
  Vec_Ptr_t *pVVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  Abc_Ntk_t *pAVar11;
  long lVar12;
  
  if (pMan->nAsserts != 0) {
    __assert_fail("pMan->nAsserts == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                  ,0x256,"Abc_Ntk_t *Abc_NtkFromAigPhase(Aig_Man_t *)");
  }
  pNtk = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
  iVar10 = pMan->nBarBufs;
  pNtk->nConstrs = pMan->nConstrs;
  pNtk->nBarBufs = iVar10;
  pAVar3 = Abc_AigConst1(pNtk);
  (pMan->pConst1->field_5).pData = pAVar3;
  uVar7 = pMan->nRegs;
  iVar10 = pMan->nObjs[2];
  if ((int)uVar7 < iVar10) {
    lVar12 = 0;
    do {
      if (pMan->vCis->nSize <= lVar12) goto LAB_002a569a;
      pvVar1 = pMan->vCis->pArray[lVar12];
      pAVar3 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PI);
      *(Abc_Obj_t **)((long)pvVar1 + 0x28) = pAVar3;
      lVar12 = lVar12 + 1;
      uVar7 = pMan->nRegs;
      iVar10 = pMan->nObjs[2];
    } while (lVar12 < (int)(iVar10 - uVar7));
  }
  uVar4 = (ulong)uVar7;
  uVar8 = pMan->nObjs[3] - uVar7;
  uVar9 = (ulong)uVar8;
  if (uVar8 != 0 && (int)uVar7 <= pMan->nObjs[3]) {
    lVar12 = 0;
    do {
      if (pMan->vCos->nSize <= lVar12) goto LAB_002a569a;
      pvVar1 = pMan->vCos->pArray[lVar12];
      pAVar3 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PO);
      *(Abc_Obj_t **)((long)pvVar1 + 0x28) = pAVar3;
      lVar12 = lVar12 + 1;
      uVar4 = (ulong)pMan->nRegs;
      uVar9 = (long)pMan->nObjs[3] - uVar4;
    } while (lVar12 < (long)uVar9);
    iVar10 = pMan->nObjs[2];
  }
  if (pNtk->vCis->nSize != iVar10 - (int)uVar4) {
    __assert_fail("Abc_NtkCiNum(pNtkNew) == Aig_ManCiNum(pMan) - Aig_ManRegNum(pMan)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                  ,0x26d,"Abc_Ntk_t *Abc_NtkFromAigPhase(Aig_Man_t *)");
  }
  if (pNtk->vCos->nSize != (int)uVar9) {
    __assert_fail("Abc_NtkCoNum(pNtkNew) == Aig_ManCoNum(pMan) - Aig_ManRegNum(pMan)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                  ,0x26e,"Abc_Ntk_t *Abc_NtkFromAigPhase(Aig_Man_t *)");
  }
  if (0 < (int)uVar4) {
    iVar10 = 0;
    do {
      uVar7 = (pMan->nObjs[3] - (int)uVar4) + iVar10;
      if (((((int)uVar7 < 0) || (pMan->vCos->nSize <= (int)uVar7)) ||
          (uVar8 = (pMan->nObjs[2] - (int)uVar4) + iVar10, (int)uVar8 < 0)) ||
         (pMan->vCis->nSize <= (int)uVar8)) goto LAB_002a569a;
      pvVar1 = pMan->vCos->pArray[uVar7];
      pvVar2 = pMan->vCis->pArray[uVar8];
      pAVar3 = Abc_NtkCreateObj(pNtk,ABC_OBJ_LATCH);
      pAVar5 = Abc_NtkCreateObj(pNtk,ABC_OBJ_BI);
      *(Abc_Obj_t **)((long)pvVar1 + 0x28) = pAVar5;
      pAVar5 = Abc_NtkCreateObj(pNtk,ABC_OBJ_BO);
      *(Abc_Obj_t **)((long)pvVar2 + 0x28) = pAVar5;
      Abc_ObjAddFanin(pAVar3,*(Abc_Obj_t **)((long)pvVar1 + 0x28));
      Abc_ObjAddFanin(*(Abc_Obj_t **)((long)pvVar2 + 0x28),pAVar3);
      if ((*(uint *)&pAVar3->field_0x14 & 0xf) != 8) {
        __assert_fail("Abc_ObjIsLatch(pLatch)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                      ,0x1a4,"void Abc_LatchSetInit0(Abc_Obj_t *)");
      }
      pAVar3->field_5 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x1;
      iVar10 = iVar10 + 1;
      uVar4 = (ulong)(uint)pMan->nRegs;
    } while (iVar10 < pMan->nRegs);
  }
  pVVar6 = Aig_ManDfs(pMan,1);
  if (0 < pVVar6->nSize) {
    lVar12 = 0;
    do {
      pvVar1 = pVVar6->pArray[lVar12];
      if ((*(uint *)((long)pvVar1 + 0x18) & 7) == 4) {
        if (((ulong)pvVar1 & 1) != 0) goto LAB_002a56b9;
        uVar4 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
        if (uVar4 == 0) {
          pAVar3 = (Abc_Obj_t *)0x0;
        }
        else {
          pAVar3 = (Abc_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^ *(ulong *)(uVar4 + 0x28));
        }
      }
      else {
        if (((ulong)pvVar1 & 1) != 0) goto LAB_002a56b9;
        uVar4 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
        if (uVar4 == 0) {
          pAVar3 = (Abc_Obj_t *)0x0;
        }
        else {
          pAVar3 = (Abc_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^ *(ulong *)(uVar4 + 0x28));
        }
        uVar4 = *(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe;
        if (uVar4 == 0) {
          pAVar5 = (Abc_Obj_t *)0x0;
        }
        else {
          pAVar5 = (Abc_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar1 + 0x10) & 1) ^ *(ulong *)(uVar4 + 0x28));
        }
        pAVar3 = Abc_AigAnd((Abc_Aig_t *)pNtk->pManFunc,pAVar3,pAVar5);
      }
      *(Abc_Obj_t **)((long)pvVar1 + 0x28) = pAVar3;
      lVar12 = lVar12 + 1;
    } while (lVar12 < pVVar6->nSize);
  }
  if (pVVar6->pArray != (void **)0x0) {
    free(pVVar6->pArray);
  }
  free(pVVar6);
  pVVar6 = pMan->vCos;
  if (0 < pVVar6->nSize) {
    lVar12 = 0;
    do {
      if (((ulong)pVVar6->pArray[lVar12] & 1) != 0) {
LAB_002a56b9:
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                      ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
      }
      uVar4 = *(ulong *)((long)pVVar6->pArray[lVar12] + 8);
      uVar9 = uVar4 & 0xfffffffffffffffe;
      if (uVar9 == 0) {
        pAVar3 = (Abc_Obj_t *)0x0;
      }
      else {
        pAVar3 = (Abc_Obj_t *)((ulong)((uint)uVar4 & 1) ^ *(ulong *)(uVar9 + 0x28));
      }
      if (pNtk->vCos->nSize <= lVar12) {
LAB_002a569a:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      Abc_ObjAddFanin((Abc_Obj_t *)pNtk->vCos->pArray[lVar12],pAVar3);
      lVar12 = lVar12 + 1;
      pVVar6 = pMan->vCos;
    } while (lVar12 < pVVar6->nSize);
  }
  Abc_NtkAddDummyPiNames(pNtk);
  Abc_NtkAddDummyPoNames(pNtk);
  Abc_NtkAddDummyBoxNames(pNtk);
  pAVar11 = pNtk;
  iVar10 = Abc_NtkCheck(pNtk);
  if (iVar10 == 0) {
    Abc_Print((int)pAVar11,"Abc_NtkFromAigPhase(): Network check has failed.\n");
  }
  return pNtk;
}

Assistant:

Abc_Ntk_t * Abc_NtkFromAigPhase( Aig_Man_t * pMan )
{
    Vec_Ptr_t * vNodes; 
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObjNew;
    Aig_Obj_t * pObj, * pObjLo, * pObjLi;
    int i; 
    assert( pMan->nAsserts == 0 );
    // perform strashing
    pNtkNew = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
    pNtkNew->nConstrs = pMan->nConstrs;
    pNtkNew->nBarBufs = pMan->nBarBufs;
    // duplicate the name and the spec
//    pNtkNew->pName = Extra_UtilStrsav(pMan->pName);
//    pNtkNew->pSpec = Extra_UtilStrsav(pMan->pSpec);
    Aig_ManConst1(pMan)->pData = Abc_AigConst1(pNtkNew);
    // create PIs
    Aig_ManForEachPiSeq( pMan, pObj, i )
    {
        pObjNew = Abc_NtkCreatePi( pNtkNew );
//        Abc_ObjAssignName( pObjNew, Abc_ObjName(pObjNew), NULL );
        pObj->pData = pObjNew;
    }
    // create POs
    Aig_ManForEachPoSeq( pMan, pObj, i )
    {
        pObjNew = Abc_NtkCreatePo( pNtkNew );
//        Abc_ObjAssignName( pObjNew, Abc_ObjName(pObjNew), NULL );
        pObj->pData = pObjNew;
    }
    assert( Abc_NtkCiNum(pNtkNew) == Aig_ManCiNum(pMan) - Aig_ManRegNum(pMan) );
    assert( Abc_NtkCoNum(pNtkNew) == Aig_ManCoNum(pMan) - Aig_ManRegNum(pMan) );
    // create as many latches as there are registers in the manager
    Aig_ManForEachLiLoSeq( pMan, pObjLi, pObjLo, i )
    {
        pObjNew = Abc_NtkCreateLatch( pNtkNew );
        pObjLi->pData = Abc_NtkCreateBi( pNtkNew );
        pObjLo->pData = Abc_NtkCreateBo( pNtkNew );
        Abc_ObjAddFanin( pObjNew, (Abc_Obj_t *)pObjLi->pData );
        Abc_ObjAddFanin( (Abc_Obj_t *)pObjLo->pData, pObjNew );
        Abc_LatchSetInit0( pObjNew );
//        Abc_ObjAssignName( (Abc_Obj_t *)pObjLi->pData, Abc_ObjName((Abc_Obj_t *)pObjLi->pData), NULL );
//        Abc_ObjAssignName( (Abc_Obj_t *)pObjLo->pData, Abc_ObjName((Abc_Obj_t *)pObjLo->pData), NULL );
    }
    // rebuild the AIG
    vNodes = Aig_ManDfs( pMan, 1 );
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        if ( Aig_ObjIsBuf(pObj) )
            pObj->pData = (Abc_Obj_t *)Aig_ObjChild0Copy(pObj);
        else
            pObj->pData = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, (Abc_Obj_t *)Aig_ObjChild0Copy(pObj), (Abc_Obj_t *)Aig_ObjChild1Copy(pObj) );
    Vec_PtrFree( vNodes );
    // connect the PO nodes
    Aig_ManForEachCo( pMan, pObj, i )
    {
        pObjNew = (Abc_Obj_t *)Aig_ObjChild0Copy(pObj);
        Abc_ObjAddFanin( Abc_NtkCo(pNtkNew, i), pObjNew );
    }

    Abc_NtkAddDummyPiNames( pNtkNew );
    Abc_NtkAddDummyPoNames( pNtkNew );
    Abc_NtkAddDummyBoxNames( pNtkNew );

    // check the resulting AIG
    if ( !Abc_NtkCheck( pNtkNew ) )
        Abc_Print( 1, "Abc_NtkFromAigPhase(): Network check has failed.\n" );
    return pNtkNew;
}